

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O3

void __thiscall
ExchangeCompilation_MissingTriple_Test::TestBody(ExchangeCompilation_MissingTriple_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  database *db;
  pointer message;
  error_code eVar2;
  mock_mutex mutex;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> compilation;
  digest compilation_digest;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  size_type __dnew;
  string_mapping imported_names;
  undefined1 local_1f1;
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  AssertHelper local_1e0;
  error_code local_1d8;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  __uniq_ptr_impl<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  transaction<std::unique_lock<mock_mutex>_> local_188;
  undefined1 local_150 [8];
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  local_148;
  error_code local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string_mapping local_a8;
  
  local_150 = (undefined1  [8])0x15;
  local_1b8 = &local_1a8;
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::_M_create((ulong *)&local_1b8,(ulong)local_150);
  local_1a8._M_dataplus._M_p = (pointer)local_150;
  (local_1b8->_M_dataplus)._M_p = (pointer)0x6e6966656422207b;
  local_1b8->_M_string_length = 0x3a22736e6f697469;
  *(undefined8 *)((long)&local_1b8->_M_string_length + 5) = 0x7d205d5b203a2273;
  local_1b0._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl =
       (tuple<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
        )(tuple<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
          )local_150;
  *(mutex_type *)((long)&(local_1b8->_M_dataplus)._M_p + (long)local_150) = (mutex_type)0x0;
  local_1a8.field_2._M_allocated_capacity = 0x9abcdef0;
  local_1a8.field_2._8_8_ = 0x12345678;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.strings_;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.views_;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.lookup_._M_h._M_buckets = &local_a8.lookup_._M_h._M_single_bucket;
  local_a8.lookup_._M_h._M_bucket_count = 1;
  local_a8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.lookup_._M_h._M_element_count = 0;
  local_a8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_150 = (undefined1  [8])&local_1f1;
  local_148.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map._0_1_ = false;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_150);
  db = &(this->super_ExchangeCompilation).import_db_;
  local_148.
  super__Deque_base<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map._0_1_ = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_188,db,(lock_type *)local_150);
  pstore::index::
  get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&local_1c8,db,true);
  anon_unknown.dwarf_a82ba::import_compilation_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_150,&local_188,&local_a8,
             &local_1c8,(digest *)&local_1a8.field_2);
  pbVar1 = local_1b8;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)local_1f0,
             (index_type)
             local_1b0._M_t.
             super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_std::default_delete<pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_>_>
             .
             super__Head_base<0UL,_pstore::json::details::singleton_storage<pstore::exchange::import_ns::callbacks>_*,_false>
             ._M_head_impl);
  local_1e8 = pbVar1;
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<pstore::exchange::import_ns::callbacks> *)local_150,
                       (span<const_char,__1L> *)local_1f0);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  eVar2 = pstore::exchange::import_ns::make_error_code(incomplete_compilation_object);
  local_1d8._M_cat = eVar2._M_cat;
  local_1d8._M_value = eVar2._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_1f0,"compilation_parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object)",
             &local_f8,&local_1d8);
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if (local_1e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_1e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x14f,message);
    testing::internal::AssertHelper::operator=(&local_1e0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._M_value) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._M_value) + 8))();
    }
  }
  if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,local_1e8);
  }
  pstore::transaction_base::commit(&local_188.super_transaction_base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque(&local_148);
  if (local_150 != (undefined1  [8])0x0) {
    operator_delete((void *)local_150,0x68);
  }
  if (local_1c8.
      super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.
               super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_188.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00234578
  ;
  pstore::transaction_base::rollback(&local_188.super_transaction_base);
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_a8);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,(ulong)(local_1a8._M_dataplus._M_p + 1));
  }
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingTriple) {
    auto const compilation = R"({ "definitions": [] })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}